

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall
WavingSketch<8U,_1U,_4U>::Init(WavingSketch<8U,_1U,_4U> *this,Data<4U> *item,uint time)

{
  byte bVar1;
  ulong uVar2;
  uint position;
  uint uVar3;
  uint uVar4;
  uint8_t *data;
  uint uVar5;
  bool bVar6;
  uint32_t k1;
  
  if (this->record < time) {
    this->record = time;
    memset(*(void **)(this->bitset + 8),0,(ulong)(*(uint *)this->bitset >> 3) + 1);
  }
  uVar5 = this->HASH_NUM;
  if (uVar5 == 0) {
    return;
  }
  uVar4 = 0;
  bVar6 = true;
  do {
    while( true ) {
      uVar3 = ((uint)(*(int *)item->str * -0x3361d2af) >> 0x11 | *(int *)item->str * 0x16a88000) *
              0x1b873593 ^ uVar4;
      uVar3 = (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
      uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      uVar2 = (ulong)(uVar3 >> 0x10 ^ uVar3) % (ulong)this->LENGTH;
      bVar1 = *(byte *)(*(long *)(this->bitset + 8) + (uVar2 >> 3));
      if ((bVar1 >> ((uint)uVar2 & 7) & 1) == 0) break;
      uVar4 = uVar4 + 1;
      if (uVar5 <= uVar4) {
        if (bVar6) {
          return;
        }
        goto LAB_00109994;
      }
    }
    *(byte *)(*(long *)(this->bitset + 8) + (uVar2 >> 3)) = (byte)(1 << ((byte)uVar2 & 7)) | bVar1;
    uVar5 = this->HASH_NUM;
    uVar4 = uVar4 + 1;
    bVar6 = false;
    if (uVar5 <= uVar4) {
LAB_00109994:
      (**(this->super_Abstract<4U>)._vptr_Abstract)(this,item);
      return;
    }
  } while( true );
}

Assistant:

void Init(const Data<DATA_LEN>& item, uint time) {
		if (time > record) {
			record = time;
			bitset->Clear();
		}

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = item.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(item);
	}